

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChFilters.cpp
# Opt level: O3

void __thiscall
chrono::utils::ChButterworth_Lowpass::Config
          (ChButterworth_Lowpass *this,uint nPoles,double step,double fc)

{
  vector<double,_std::allocator<double>_> *this_00;
  ulong uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  pointer pdVar4;
  pointer pdVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pdVar9;
  pointer pdVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  undefined1 auVar14 [16];
  uint uVar15;
  size_type __new_size;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  double dVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  double dVar23;
  undefined1 auVar24 [16];
  undefined8 in_XMM2_Qb;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  this_00 = &this->m_Q;
  this->m_Ts = step;
  uVar17 = 1;
  if (1 < nPoles) {
    uVar17 = nPoles;
  }
  uVar18 = 6;
  if (uVar17 < 6) {
    uVar18 = (ulong)uVar17;
  }
  uVar17 = (uint)uVar18;
  __new_size = 0;
  if (1 < nPoles) {
    __new_size = uVar18 >> 1;
  }
  uVar15 = uVar17 & 1;
  if (nPoles < 2) {
    uVar15 = 1;
  }
  this->m_n_single = uVar15;
  this->m_n_biquad = (uint)__new_size;
  std::vector<double,_std::allocator<double>_>::resize(this_00,__new_size);
  if (this->m_n_single == 1) {
    if (2 < nPoles) {
      uVar18 = 0;
      do {
        uVar16 = uVar18 + 1;
        auVar20._0_8_ = (double)(int)uVar16;
        auVar20._8_8_ = in_XMM2_Qb;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = (double)(int)uVar17;
        auVar14 = vfmadd213sd_fma(auVar20,ZEXT816(0x4000000000000000),auVar3);
        dVar19 = cos(((auVar14._0_8_ + -1.0) * 3.141592653589793) / (double)(int)(uVar17 * 2));
        (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar18] = dVar19 * -2.0;
        uVar18 = uVar16;
      } while (uVar17 - 1 >> 1 != uVar16);
    }
  }
  else if (1 < nPoles) {
    uVar16 = (ulong)nPoles + (ulong)((ulong)nPoles == 0);
    uVar18 = 6;
    if (uVar16 < 6) {
      uVar18 = uVar16;
    }
    uVar16 = 0;
    do {
      uVar1 = uVar16 + 1;
      auVar21._0_8_ = (double)(int)uVar1;
      auVar21._8_8_ = in_XMM2_Qb;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = (double)(int)uVar17;
      auVar14 = vfmadd213sd_fma(auVar21,ZEXT816(0x4000000000000000),auVar14);
      dVar19 = cos(((auVar14._0_8_ + -1.0) * 3.141592653589793) / (double)(int)(uVar17 * 2));
      (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
      ._M_start[uVar16] = dVar19 * -2.0;
      uVar16 = uVar1;
    } while ((uVar18 >> 1 & 0x7fffffff) != uVar1);
  }
  dVar11 = fc * 6.283185307179586;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a0,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a1,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_a2,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b0,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b1,(ulong)this->m_n_biquad);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_b2,(ulong)this->m_n_biquad);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = dVar11;
  dVar19 = this->m_Ts;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = dVar19;
  if (this->m_n_single == 1) {
    auVar14 = vfmadd231sd_fma(ZEXT816(0x4000000000000000),auVar22,auVar28);
    auVar21 = vfmadd231sd_fma(ZEXT816(0xc000000000000000),auVar22,auVar28);
    dVar23 = (dVar11 * dVar19) / auVar14._0_8_;
    this->m_b0 = dVar23;
    this->m_b1 = dVar23;
    this->m_a1 = auVar21._0_8_ / auVar14._0_8_;
    this->m_a0 = 1.0;
  }
  uVar18 = (ulong)this->m_n_biquad;
  if (uVar18 != 0) {
    pdVar4 = (this_00->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->m_biq_b0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->m_biq_b1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->m_biq_b2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar8 = (this->m_biq_a2).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = 0;
    dVar23 = dVar11 * dVar19 * dVar19;
    pdVar9 = (this->m_biq_a0).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar10 = (this->m_biq_a1).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    dVar12 = dVar11 * dVar19 * (dVar19 + dVar19);
    dVar13 = dVar11 * dVar23;
    auVar25._8_8_ = 0;
    auVar25._0_8_ = dVar12;
    auVar14 = vfmadd213sd_fma(auVar25,auVar28,ZEXT816(0xc020000000000000));
    do {
      pdVar5[uVar16] = dVar13;
      pdVar6[uVar16] = dVar11 * dVar12;
      pdVar7[uVar16] = dVar13;
      dVar2 = pdVar4[uVar16];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar23;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = dVar11 * dVar19 * (dVar2 + dVar2);
      auVar21 = vfmadd231sd_fma(auVar26,auVar24,auVar28);
      pdVar9[uVar16] = auVar21._0_8_ + 4.0;
      pdVar10[uVar16] = auVar14._0_8_;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = dVar11 * dVar19 * pdVar4[uVar16] * -2.0;
      auVar21 = vfmadd231sd_fma(auVar27,auVar24,auVar28);
      pdVar8[uVar16] = auVar21._0_8_ + 4.0;
      pdVar5[uVar16] = pdVar5[uVar16] / pdVar9[uVar16];
      pdVar6[uVar16] = pdVar6[uVar16] / pdVar9[uVar16];
      pdVar7[uVar16] = pdVar7[uVar16] / pdVar9[uVar16];
      pdVar10[uVar16] = pdVar10[uVar16] / pdVar9[uVar16];
      pdVar8[uVar16] = pdVar8[uVar16] / pdVar9[uVar16];
      pdVar9[uVar16] = 1.0;
      uVar16 = uVar16 + 1;
    } while (uVar18 != uVar16);
  }
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_u_hist1,uVar18);
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_u_hist2,(ulong)this->m_n_biquad)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_y_hist1,(ulong)this->m_n_biquad)
  ;
  std::vector<double,_std::allocator<double>_>::resize(&this->m_biq_y_hist2,(ulong)this->m_n_biquad)
  ;
  Reset(this);
  return;
}

Assistant:

void ChButterworth_Lowpass::Config(unsigned int nPoles, double step, double fc) {
    const unsigned int nPolesMin = 1;
    const unsigned int nPolesMax = 6;

    m_Ts = step;
    double wc = fc * CH_C_2PI;

    if (nPoles < nPolesMin) {
        nPoles = 1;
    }
    if (nPoles > nPolesMax) {
        nPoles = nPolesMax;
    }

    if (nPoles == 1) {
        m_n_single = 1;
        m_n_biquad = 0;
    } else {
        m_n_biquad = nPoles / 2;
        m_n_single = nPoles % 2;
    }
    m_Q.resize(m_n_biquad);
    if (m_n_single == 1) {
        for (unsigned int k = 1; k <= (nPoles - 1) / 2; k++) {
            m_Q[k - 1] = -2.0 * cos(CH_C_PI * (2.0 * k + nPoles - 1) / (2.0 * nPoles));
        }
    } else {
        for (unsigned int k = 1; k <= nPoles / 2; k++) {
            m_Q[k - 1] = -2.0 * cos(CH_C_PI * (2.0 * k + nPoles - 1) / (2.0 * nPoles));
        }
    }

    m_biq_a0.resize(m_n_biquad);
    m_biq_a1.resize(m_n_biquad);
    m_biq_a2.resize(m_n_biquad);
    m_biq_b0.resize(m_n_biquad);
    m_biq_b1.resize(m_n_biquad);
    m_biq_b2.resize(m_n_biquad);

    double T = m_Ts;

    if (m_n_single == 1) {
        m_b0 = T * wc;
        m_b1 = T * wc;

        m_a0 = T * wc + 2.0;
        m_a1 = T * wc - 2.0;

        m_b0 /= m_a0;
        m_b1 /= m_a0;
        m_a1 /= m_a0;
        m_a0 = 1.0;
    }
    for (size_t i = 0; i < m_n_biquad; i++) {
        m_biq_b0[i] = T * T * wc * wc;
        m_biq_b1[i] = 2.0 * T * T * wc * wc;
        m_biq_b2[i] = T * T * wc * wc;

        m_biq_a0[i] = T * T * wc * wc + 2.0 * m_Q[i] * T * wc + 4.0;
        m_biq_a1[i] = (2.0 * T * T * wc * wc - 8.0);
        m_biq_a2[i] = T * T * wc * wc - 2.0 * m_Q[i] * T * wc + 4.0;

        m_biq_b0[i] /= m_biq_a0[i];
        m_biq_b1[i] /= m_biq_a0[i];
        m_biq_b2[i] /= m_biq_a0[i];

        m_biq_a1[i] /= m_biq_a0[i];
        m_biq_a2[i] /= m_biq_a0[i];
        m_biq_a0[i] = 1.0;
    }
    m_biq_u_hist1.resize(m_n_biquad);
    m_biq_u_hist2.resize(m_n_biquad);
    m_biq_y_hist1.resize(m_n_biquad);
    m_biq_y_hist2.resize(m_n_biquad);

    Reset();
}